

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O2

void Abc_NtkFraigStoreClean(void)

{
  Vec_Ptr_t *p;
  Abc_Ntk_t *pNtk;
  int i;
  
  p = Abc_FrameReadStore();
  for (i = 0; i < p->nSize; i = i + 1) {
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry(p,i);
    Abc_NtkDelete(pNtk);
  }
  p->nSize = 0;
  return;
}

Assistant:

void Abc_NtkFraigStoreClean()
{
    Vec_Ptr_t * vStore;
    Abc_Ntk_t * pNtk;
    int i;
    vStore = Abc_FrameReadStore();
    Vec_PtrForEachEntry( Abc_Ntk_t *, vStore, pNtk, i )
        Abc_NtkDelete( pNtk );
    Vec_PtrClear( vStore );
}